

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O0

int outformatlen_stream(out_stream_info *stream,char *s,size_t slen)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  ushort **ppuVar5;
  size_t sVar6;
  long in_RDX;
  byte *pbVar7;
  byte *in_RSI;
  out_stream_info *in_RDI;
  int is_end_tag_1;
  char tagbuf_1 [50];
  char xlat_buf [50];
  uint htmlchar;
  int cur;
  char dashbuf [100];
  int rem;
  int attr;
  int is_end_tag;
  char tagbuf [50];
  char *cbp;
  char cbuf [50];
  int ht;
  char qu;
  char *dst;
  char attrval [256];
  char attrname [128];
  int old_all_caps;
  uint len;
  uint propnum;
  char fmsbuf_srch [40];
  int allcaps;
  int initcap;
  uchar *fms;
  int infmt;
  char *f1;
  char *f;
  uint fmslen;
  char fmsbuf [40];
  int done;
  char c;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  char cVar8;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  uint in_stack_fffffffffffffb98;
  int in_stack_fffffffffffffb9c;
  out_stream_info *in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  char *in_stack_fffffffffffffbb0;
  uint in_stack_fffffffffffffbcc;
  out_stream_info *in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffc34;
  char **in_stack_fffffffffffffc38;
  size_t in_stack_fffffffffffffc40;
  char *in_stack_fffffffffffffc48;
  uint local_34c;
  undefined1 local_348 [100];
  uint local_2e4;
  uint local_2e0;
  int local_2dc;
  char local_2d8;
  prpnum in_stack_fffffffffffffd40;
  objnum in_stack_fffffffffffffd42;
  prpnum in_stack_fffffffffffffd44;
  objnum in_stack_fffffffffffffd46;
  uchar **in_stack_fffffffffffffd48;
  runcxdef *in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd68;
  objnum in_stack_fffffffffffffd70;
  int local_258;
  byte local_251;
  byte *local_250;
  byte local_248 [256];
  byte local_148 [128];
  byte abStack_c8 [4];
  uint local_c4;
  uint local_c0;
  int local_bc;
  char local_b8 [48];
  int local_88;
  int local_84;
  uchar *local_80;
  int local_74;
  byte *local_70;
  byte *local_68;
  uint local_5c;
  byte local_58;
  byte local_57;
  byte abStack_30 [8];
  int local_28;
  byte local_21;
  long local_20;
  byte *local_18;
  out_stream_info *local_10;
  
  local_28 = 0;
  local_68 = (byte *)0x0;
  local_74 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar3 = out_push_stream(in_RDI);
  if (iVar3 != 0) {
    if (local_20 == 0) {
      iVar3 = 0;
    }
    else {
      local_20 = local_20 + -1;
      iVar3 = (int)(char)*local_18;
      local_18 = local_18 + 1;
    }
    local_21 = (byte)iVar3;
LAB_0027dbbc:
    cVar8 = (char)((uint)in_stack_fffffffffffffb8c >> 0x18);
    if (local_21 != 0) {
      if (local_74 == 0) {
        if (local_10->html_mode_flag == 0) {
          if ((local_10->html_in_ignore != 0) && (local_21 != 0x3c)) {
            if (local_21 == 0x26) {
              local_21 = out_parse_entity(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                                          in_stack_fffffffffffffc38,
                                          (size_t *)CONCAT44(in_stack_fffffffffffffc34,iVar3));
            }
            else {
              in_stack_fffffffffffffd68 =
                   CONCAT22((short)((uint)in_stack_fffffffffffffd68 >> 0x10),(ushort)local_21);
              if (local_20 == 0) {
                local_21 = 0;
              }
              else {
                local_20 = local_20 + -1;
                local_21 = *local_18;
                local_18 = local_18 + 1;
              }
            }
            if (local_10->html_in_title != 0) {
              for (in_stack_fffffffffffffd60 = &stack0xfffffffffffffd68;
                  *in_stack_fffffffffffffd60 != '\0';
                  in_stack_fffffffffffffd60 = in_stack_fffffffffffffd60 + 1) {
                if (local_10->html_title_ptr + 1 < &local_10->html_title_ptr) {
                  cVar8 = *in_stack_fffffffffffffd60;
                  pcVar2 = local_10->html_title_ptr;
                  local_10->html_title_ptr = pcVar2 + 1;
                  *pcVar2 = cVar8;
                }
              }
            }
            goto LAB_0027dbbc;
          }
          if (local_21 == 0x25) {
            local_74 = 1;
            local_68 = &local_58;
          }
          else if (local_21 == 0x5c) {
            if (local_20 == 0) {
              local_21 = 0;
            }
            else {
              local_20 = local_20 + -1;
              local_21 = *local_18;
              local_18 = local_18 + 1;
            }
            if ((((local_10->capturing == 0) || (local_21 == 0x5e)) || (local_21 == 0x76)) ||
               (local_21 == 0)) {
              if (local_21 == 0) {
                local_28 = 1;
              }
              else if (local_21 == 0x20) {
                if ((local_10->html_target == 0) || (local_10->html_mode == 0)) {
                  outchar_stream((out_stream_info *)
                                 CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),cVar8
                                );
                }
                else {
                  outstring_stream((out_stream_info *)
                                   CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                                   (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                    in_stack_fffffffffffffb88));
                }
              }
              else if (local_21 == 0x28) {
                if ((local_10->html_mode == 0) || (local_10->html_target == 0)) {
                  local_10->cur_attr = local_10->cur_attr | 1;
                }
                else {
                  outstring_stream((out_stream_info *)
                                   CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                                   (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                    in_stack_fffffffffffffb88));
                }
              }
              else if (local_21 == 0x29) {
                if ((local_10->html_mode == 0) || (local_10->html_target == 0)) {
                  local_10->cur_attr = local_10->cur_attr & 0xfffffffe;
                }
                else {
                  outstring_stream((out_stream_info *)
                                   CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                                   (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                    in_stack_fffffffffffffb88));
                }
              }
              else if (local_21 == 0x2d) {
                if (local_20 == 0) {
                  in_stack_fffffffffffffbcc = 0;
                }
                else {
                  local_20 = local_20 + -1;
                  in_stack_fffffffffffffbcc = (uint)(char)*local_18;
                  local_18 = local_18 + 1;
                }
                in_stack_fffffffffffffbd0 = local_10;
                outchar_stream((out_stream_info *)
                               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),cVar8);
                if (local_20 != 0) {
                  local_20 = local_20 + -1;
                  local_18 = local_18 + 1;
                }
                outchar_stream((out_stream_info *)
                               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                               (char)((uint)in_stack_fffffffffffffb8c >> 0x18));
              }
              else if (local_21 == 0x48) {
                if (local_20 == 0) {
                  local_21 = 0;
                }
                else {
                  local_20 = local_20 + -1;
                  local_21 = *local_18;
                  local_18 = local_18 + 1;
                }
                if ((local_21 == 0x2b) || (local_21 != 0x2d)) {
                  if (local_10->html_target != 0) {
                    outflushn_stream(in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
                  }
                  local_10->html_mode = 1;
                  if ((local_21 != 0x2b) && (local_21 != 0)) {
                    outchar_stream((out_stream_info *)
                                   CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                                   (char)((uint)in_stack_fffffffffffffb8c >> 0x18));
                  }
                }
                else {
                  if (local_10->html_target != 0) {
                    outflushn_stream(in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
                  }
                  local_10->html_mode = 0;
                }
              }
              else if (local_21 == 0x5e) {
                local_10->capsflag = '\x01';
                local_10->nocapsflag = '\0';
              }
              else if (local_21 == 0x62) {
                outblank_stream((out_stream_info *)0x27ece5);
              }
              else if (local_21 == 0x6e) {
                outflushn_stream(in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
              }
              else if (local_21 == 0x74) {
                outtab_stream((out_stream_info *)
                              CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
              }
              else if (local_21 == 0x76) {
                local_10->nocapsflag = '\x01';
                local_10->capsflag = '\0';
              }
              else {
                outchar_stream((out_stream_info *)
                               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),cVar8);
              }
            }
            else {
              outchar_stream((out_stream_info *)
                             CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),cVar8);
              outchar_stream((out_stream_info *)
                             CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                             (char)((uint)in_stack_fffffffffffffb8c >> 0x18));
              if (local_21 == 0x2d) {
                if (local_20 != 0) {
                  local_20 = local_20 + -1;
                  local_18 = local_18 + 1;
                }
                outchar_stream((out_stream_info *)
                               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                               (char)((uint)in_stack_fffffffffffffb8c >> 0x18));
                if (local_20 != 0) {
                  local_20 = local_20 + -1;
                  local_18 = local_18 + 1;
                }
                outchar_stream((out_stream_info *)
                               CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                               (char)((uint)in_stack_fffffffffffffb8c >> 0x18));
              }
            }
          }
          else if (((local_10->html_target == 0) && (local_10->html_mode != 0)) &&
                  ((local_21 == 0x3c || (local_21 == 0x26)))) {
            if (local_21 == 0x3c) {
              local_21 = read_tag(in_stack_fffffffffffffbb0,
                                  CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                                  (int *)in_stack_fffffffffffffba0,
                                  (char **)CONCAT44(in_stack_fffffffffffffb9c,
                                                    in_stack_fffffffffffffb98),
                                  (size_t *)
                                  CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                                  (out_stream_info *)
                                  CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
              iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                              (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88))
              ;
              if (iVar4 == 0) {
                if (local_10->html_in_ignore == 0) {
                  if (local_10->linepos == '\0') {
                    local_10->html_defer_br = 2;
                  }
                  else {
                    local_10->html_defer_br = 1;
                  }
                }
              }
              else {
                iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90
                                                ),
                                (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88
                                                ));
                if (((iVar4 == 0) ||
                    (iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,
                                                      in_stack_fffffffffffffb90),
                                     (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                      in_stack_fffffffffffffb88)), iVar4 == 0)) ||
                   ((iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,
                                                      in_stack_fffffffffffffb90),
                                     (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                      in_stack_fffffffffffffb88)), iVar4 == 0 ||
                    (iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,
                                                      in_stack_fffffffffffffb90),
                                     (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                      in_stack_fffffffffffffb88)), iVar4 == 0)))) {
                  in_stack_fffffffffffffbb0 = (char *)(ulong)((int)local_2d8 - 0x42);
                  switch(in_stack_fffffffffffffbb0) {
                  case (char *)0x0:
                  case (char *)0x20:
                    local_2e0 = 1;
                    break;
                  case (char *)0x3:
                  case (char *)0x23:
                    local_2e0 = 1;
                    break;
                  case (char *)0x7:
                  case (char *)0x27:
                    local_2e0 = 2;
                    break;
                  case (char *)0x11:
                  case (char *)0x31:
                    local_2e0 = 0;
                  }
                  if (local_10->html_in_ignore == 0) {
                    if (local_2dc == 0) {
                      local_10->cur_attr = local_2e0 | local_10->cur_attr;
                    }
                    else {
                      local_10->cur_attr = (local_2e0 ^ 0xffffffff) & local_10->cur_attr;
                    }
                  }
                }
                else {
                  iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,
                                                   in_stack_fffffffffffffb90),
                                  (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                   in_stack_fffffffffffffb88));
                  if (iVar4 == 0) {
                    if (local_10->html_in_ignore == 0) {
                      outblank_stream((out_stream_info *)0x27f170);
                    }
                  }
                  else {
                    iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,
                                                     in_stack_fffffffffffffb90),
                                    (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                     in_stack_fffffffffffffb88));
                    if (iVar4 == 0) {
                      if (local_10->html_in_ignore == 0) {
                        outtab_stream((out_stream_info *)
                                      CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90))
                        ;
                      }
                    }
                    else {
                      iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,
                                                       in_stack_fffffffffffffb90),
                                      (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                       in_stack_fffffffffffffb88));
                      if ((iVar4 == 0) ||
                         (iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,
                                                           in_stack_fffffffffffffb90),
                                          (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                           in_stack_fffffffffffffb88)), iVar4 == 0))
                      {
                        local_10->html_allow_alt = 1;
                      }
                      else {
                        iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,
                                                         in_stack_fffffffffffffb90),
                                        (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                         in_stack_fffffffffffffb88));
                        if (iVar4 == 0) {
                          if (local_10->html_in_ignore == 0) {
                            outflushn_stream(in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
                            for (local_2e4 = G_os_linewidth - 1; 0 < (int)local_2e4;
                                local_2e4 = local_2e4 - local_34c) {
                              local_34c = local_2e4;
                              if (99 < local_2e4) {
                                local_34c = 99;
                              }
                              memset(local_348,0x5f,(long)(int)local_34c);
                              local_348[(int)local_34c] = 0;
                              outstring_stream((out_stream_info *)
                                               CONCAT44(in_stack_fffffffffffffb94,
                                                        in_stack_fffffffffffffb90),
                                               (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                                in_stack_fffffffffffffb88));
                            }
                            outblank_stream((out_stream_info *)0x27f2ee);
                          }
                        }
                        else {
                          iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,
                                                           in_stack_fffffffffffffb90),
                                          (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                           in_stack_fffffffffffffb88));
                          if (iVar4 == 0) {
                            if (local_10->html_in_ignore == 0) {
                              if (local_2dc == 0) {
                                local_10->html_quote_level = local_10->html_quote_level + 1;
                                in_stack_fffffffffffffbac = 0x2018;
                                if ((local_10->html_quote_level & 1U) == 1) {
                                  in_stack_fffffffffffffbac = 0x201c;
                                }
                              }
                              else {
                                in_stack_fffffffffffffbac = 0x2019;
                                if ((local_10->html_quote_level & 1U) == 1) {
                                  in_stack_fffffffffffffbac = 0x201d;
                                }
                              }
                              outchar_html_stream(in_stack_fffffffffffffbd0,
                                                  in_stack_fffffffffffffbcc);
                              if (local_2dc != 0) {
                                local_10->html_quote_level = local_10->html_quote_level + -1;
                              }
                            }
                          }
                          else {
                            iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,
                                                             in_stack_fffffffffffffb90),
                                            (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                             in_stack_fffffffffffffb88));
                            if (iVar4 == 0) {
                              if (local_2dc == 0) {
                                if (local_10->html_in_title == 0) {
                                  local_10->html_title_ptr = local_10->html_title_buf;
                                }
                                local_10->html_in_ignore = local_10->html_in_ignore + 1;
                                local_10->html_in_title = local_10->html_in_title + 1;
                              }
                              else {
                                local_10->html_in_ignore = local_10->html_in_ignore + -1;
                                local_10->html_in_title = local_10->html_in_title + -1;
                                if (local_10->html_in_title == 0) {
                                  *local_10->html_title_ptr = '\0';
                                  os_set_title(local_10->html_title_buf);
                                }
                              }
                            }
                            else {
                              iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,
                                                               in_stack_fffffffffffffb90),
                                              (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                               in_stack_fffffffffffffb88));
                              if (iVar4 == 0) {
                                if (local_2dc == 0) {
                                  local_10->html_in_ignore = local_10->html_in_ignore + 1;
                                }
                                else {
                                  local_10->html_in_ignore = local_10->html_in_ignore + -1;
                                }
                              }
                              else {
                                iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,
                                                                 in_stack_fffffffffffffb90),
                                                (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                                 in_stack_fffffffffffffb88));
                                if (iVar4 == 0) {
                                  if (local_2dc == 0) {
                                    local_10->html_pre_level = local_10->html_pre_level + 1;
                                  }
                                  outblank_stream((out_stream_info *)0x27f56f);
                                  if ((local_2dc != 0) && (local_10->html_pre_level != 0)) {
                                    local_10->html_pre_level = local_10->html_pre_level + -1;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              local_10->html_mode_flag = 1;
              goto LAB_0027dbbc;
            }
            if (local_21 == 0x26) {
              local_21 = out_parse_entity(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                                          in_stack_fffffffffffffc38,
                                          (size_t *)CONCAT44(in_stack_fffffffffffffc34,iVar3));
              outstring_noxlat_stream
                        ((out_stream_info *)
                         CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                         (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
              goto LAB_0027dbbc;
            }
          }
          else if (((local_10->html_target == 0) || (local_10->html_mode == 0)) ||
                  (local_21 != 0x3c)) {
            outchar_stream((out_stream_info *)
                           CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),cVar8);
          }
          else {
            local_21 = read_tag(in_stack_fffffffffffffbb0,
                                CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8),
                                (int *)in_stack_fffffffffffffba0,
                                (char **)CONCAT44(in_stack_fffffffffffffb9c,
                                                  in_stack_fffffffffffffb98),
                                (size_t *)
                                CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                                (out_stream_info *)
                                CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
            iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                            (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
            if (iVar4 == 0) {
              if (in_stack_fffffffffffffc34 == 0) {
                local_10->html_pre_level = local_10->html_pre_level + 1;
              }
              else if ((in_stack_fffffffffffffc34 != 0) && (local_10->html_pre_level != 0)) {
                local_10->html_pre_level = local_10->html_pre_level + -1;
              }
            }
            if (local_21 != '\0') {
              outchar_stream((out_stream_info *)
                             CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                             (char)((uint)in_stack_fffffffffffffb8c >> 0x18));
            }
          }
          if (local_28 == 0) {
            if (local_20 == 0) {
              in_stack_fffffffffffffba8 = 0;
            }
            else {
              local_20 = local_20 + -1;
              in_stack_fffffffffffffba8 = (int)(char)*local_18;
              local_18 = local_18 + 1;
            }
            local_21 = (byte)in_stack_fffffffffffffba8;
          }
          else {
            local_21 = 0;
          }
          goto LAB_0027dbbc;
        }
        uVar1 = local_10->html_mode_flag;
        if (uVar1 == 1) {
          if (local_21 == 0x22) {
            local_10->html_mode_flag = 3;
          }
          else if (local_21 == 0x27) {
            local_10->html_mode_flag = 2;
          }
          else if (local_21 == 0x3e) {
            local_10->html_mode_flag = 0;
            uVar1 = local_10->html_defer_br;
            if (uVar1 != 0) {
              if (uVar1 == 1) {
                outflushn_stream(in_stack_fffffffffffffba0,in_stack_fffffffffffffb9c);
              }
              else if (uVar1 == 2) {
                outblank_stream((out_stream_info *)0x27e143);
              }
            }
            local_10->html_defer_br = 0;
            local_10->html_allow_alt = 0;
          }
          else if ((local_21 < 0x80) &&
                  (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(uint)local_21] & 0x400) != 0)) {
            local_250 = local_148;
            while (local_250 + 1 < abStack_c8) {
              pbVar7 = local_250 + 1;
              *local_250 = local_21;
              if (local_20 == 0) {
                local_21 = 0;
              }
              else {
                local_20 = local_20 + -1;
                local_21 = *local_18;
                local_18 = local_18 + 1;
              }
              local_250 = pbVar7;
              if (((0x7f < local_21) ||
                  (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(uint)local_21] & 0x400) == 0)) &&
                 ((0x7f < local_21 ||
                  (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(uint)local_21] & 0x800) == 0))))
              break;
            }
            *local_250 = 0;
            if (local_21 == 0x3d) {
              if (local_20 == 0) {
                local_21 = 0;
              }
              else {
                local_20 = local_20 + -1;
                local_21 = *local_18;
                local_18 = local_18 + 1;
              }
              if ((local_21 == 0x22) || (local_21 == 0x27)) {
                local_251 = local_21;
                if (local_20 == 0) {
                  local_21 = 0;
                }
                else {
                  local_20 = local_20 + -1;
                  local_21 = *local_18;
                  local_18 = local_18 + 1;
                }
              }
              else {
                local_251 = 0;
              }
              local_250 = local_248;
              do {
                while( true ) {
                  if (local_148 <= local_250 + 1) goto LAB_0027e58e;
                  pbVar7 = local_250 + 1;
                  *local_250 = local_21;
                  if (local_20 == 0) {
                    local_21 = 0;
                  }
                  else {
                    local_20 = local_20 + -1;
                    local_21 = *local_18;
                    local_18 = local_18 + 1;
                  }
                  local_250 = pbVar7;
                  if (local_21 == 0) {
                    if (local_251 == 0x22) {
                      local_10->html_mode_flag = 3;
                    }
                    else if (local_251 == 0x27) {
                      local_10->html_mode_flag = 2;
                    }
                    else {
                      local_10->html_mode_flag = 1;
                    }
                    goto LAB_0027e58e;
                  }
                  if (local_251 != 0) break;
                  if (((0x7f < local_21) ||
                      (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(uint)local_21] & 0x400) == 0))
                     && ((0x7f < local_21 ||
                         (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(uint)local_21] & 0x800) == 0)
                         ))) goto LAB_0027e58e;
                }
              } while (local_21 != local_251);
LAB_0027e58e:
              if ((local_251 != 0) && (local_21 == local_251)) {
                if (local_20 == 0) {
                  local_21 = 0;
                }
                else {
                  local_20 = local_20 + -1;
                  local_21 = *local_18;
                  local_18 = local_18 + 1;
                }
              }
              *local_250 = 0;
            }
            else {
              local_248[0] = 0;
            }
            iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                            (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88));
            if ((iVar4 == 0) && (local_10->html_defer_br != 0)) {
              local_258 = atoi((char *)local_248);
              if (local_258 == 0) {
                local_10->html_defer_br = 1;
              }
              else if (local_258 != 1) {
                for (; 0 < local_258; local_258 = local_258 + -1) {
                  outblank_stream((out_stream_info *)0x27e6a2);
                }
              }
            }
            else {
              iVar4 = stricmp((char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                              (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88))
              ;
              if ((iVar4 == 0) &&
                 ((local_10->html_in_ignore == 0 && (local_10->html_allow_alt != 0)))) {
                outstring_stream((out_stream_info *)
                                 CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                                 (char *)CONCAT44(in_stack_fffffffffffffb8c,
                                                  in_stack_fffffffffffffb88));
              }
            }
            goto LAB_0027dbbc;
          }
        }
        else if (uVar1 == 2) {
          if (local_21 == 0x27) {
            local_10->html_mode_flag = 1;
          }
        }
        else if ((uVar1 == 3) && (local_21 == 0x22)) {
          local_10->html_mode_flag = 1;
        }
        if (local_20 == 0) {
          local_21 = 0;
        }
        else {
          local_20 = local_20 + -1;
          local_21 = *local_18;
          local_18 = local_18 + 1;
        }
        goto LAB_0027dbbc;
      }
      if (((local_21 == 0x5c) || (local_68 == abStack_30)) ||
         ((local_10->html_mode != 0 && ((local_21 == 0x3c || (local_21 == 0x26)))))) {
        outchar_stream((out_stream_info *)
                       CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),cVar8);
        for (local_70 = &local_58; local_70 < local_68; local_70 = local_70 + 1) {
          outchar_stream((out_stream_info *)
                         CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                         (char)((uint)in_stack_fffffffffffffb8c >> 0x18));
        }
        local_74 = 0;
      }
      else {
        if ((local_21 == 0x25) && (local_68 == &local_58)) {
          outchar_stream((out_stream_info *)
                         CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),cVar8);
          local_74 = 0;
        }
        else if (local_21 == 0x25) {
          local_84 = 0;
          local_88 = 0;
          *local_68 = 0;
          if ((((local_58 < 0x80) &&
               (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(uint)local_58] & 0x100) != 0)) &&
              (local_84 = 1, local_57 != 0)) &&
             ((local_57 < 0x80 &&
              (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(uint)local_57] & 0x100) != 0)))) {
            local_88 = 1;
          }
          strcpy(local_b8,(char *)&local_58);
          os_strlwr((char *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
          sVar6 = strlen(local_b8);
          local_5c = (uint)sVar6;
          for (local_80 = fmsbase; local_80 < fmstop; local_80 = local_80 + (local_c0 + 4)) {
            local_bc = osrp2(local_80);
            iVar4 = osrp2(local_80 + 2);
            local_c0 = iVar4 - 2;
            if ((local_c0 == local_5c) &&
               (iVar4 = memcmp(local_80 + 4,local_b8,(ulong)local_c0), iVar4 == 0)) {
              local_c4 = (uint)local_10->allcapsflag;
              if (local_88 == 0) {
                if (local_84 != 0) {
                  outcaps_stream(local_10);
                }
              }
              else {
                outallcaps_stream(local_10,1);
              }
              in_stack_fffffffffffffb88 = 0;
              in_stack_fffffffffffffb90 = 0;
              in_stack_fffffffffffffb98 = (uint)cmdActor;
              runpprop(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd46
                       ,in_stack_fffffffffffffd44,in_stack_fffffffffffffd42,
                       in_stack_fffffffffffffd40,(int)in_stack_fffffffffffffd60,
                       in_stack_fffffffffffffd68,in_stack_fffffffffffffd70);
              outallcaps_stream(local_10,local_c4);
              break;
            }
          }
          if (local_80 == fmstop) {
            outchar_stream((out_stream_info *)
                           CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                           (char)((uint)in_stack_fffffffffffffb8c >> 0x18));
            for (local_70 = &local_58; cVar8 = (char)((uint)in_stack_fffffffffffffb8c >> 0x18),
                local_70 < local_68; local_70 = local_70 + 1) {
              outchar_stream((out_stream_info *)
                             CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),cVar8);
            }
            outchar_stream((out_stream_info *)
                           CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),cVar8);
          }
          local_74 = 0;
        }
        else {
          *local_68 = local_21;
          local_68 = local_68 + 1;
        }
        if (local_20 == 0) {
          local_21 = 0;
        }
        else {
          local_20 = local_20 + -1;
          local_21 = *local_18;
          local_18 = local_18 + 1;
        }
      }
      goto LAB_0027dbbc;
    }
    if (local_74 != 0) {
      outchar_stream((out_stream_info *)
                     CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),cVar8);
      for (local_70 = &local_58; local_70 < local_68; local_70 = local_70 + 1) {
        outchar_stream((out_stream_info *)
                       CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                       (char)((uint)in_stack_fffffffffffffb8c >> 0x18));
      }
    }
    out_pop_stream();
  }
  return 0;
}

Assistant:

static int outformatlen_stream(out_stream_info *stream,
                               char *s, size_t slen)
{
    char     c;
    int      done = 0;
    char     fmsbuf[40];       /* space for constructing translation string */
    uint     fmslen;
    char    *f = 0;
    char    *f1;
    int      infmt = 0;

    /* 
     *   This routine can recurse because of format strings ("%xxx%"
     *   sequences).  When we recurse, we want to ensure that the
     *   recursion is directed to the original stream only.  So, note the
     *   current stream statically in case we re-enter the formatter. 
     */
    if (!out_push_stream(stream))
        return 0;

    /* get the first character */
    c = nextout(&s, &slen);

    /* if we have anything to show, show it */
    while (c != '\0')
    {
        /* check if we're collecting translation string */
        if (infmt)
        {
            /*
             *   if the string is too long for our buffer, or we've come
             *   across a backslash (illegal in a format string), or we've
             *   come across an HTML-significant character ('&' or '<') in
             *   HTML mode, we must have a stray percent sign; dump the
             *   whole string so far and act as though we have no format
             *   string 
             */
            if (c == '\\'
                || f == &fmsbuf[sizeof(fmsbuf)]
                || (stream->html_mode && (c == '<' || c == '&')))
            {
                outchar_stream(stream, '%');
                for (f1 = fmsbuf ; f1 < f ; ++f1)
                    outchar_stream(stream, *f1);
                infmt = 0;

                /* process this character again */
                continue;
            }
            else if (c == '%' && f == fmsbuf)       /* double percent sign? */
            {
                outchar_stream(stream, '%');       /* send out a single '%' */
                infmt = 0;       /* no longer processing translation string */
            }
            else if (c == '%')   /* found end of string? translate it if so */
            {
                uchar *fms;
                int    initcap = FALSE;
                int    allcaps = FALSE;
                char   fmsbuf_srch[sizeof(fmsbuf)];

                /* null-terminate the string */
                *f = '\0';

                /* check for an init cap */
                if (outisup(fmsbuf[0]))
                {
                    /* 
                     *   note the initial capital, so that we follow the
                     *   original capitalization in the substituted string 
                     */
                    initcap = TRUE;

                    /* 
                     *   if the second letter is capitalized as well,
                     *   capitalize the entire substituted string 
                     */
                    if (fmsbuf[1] != '\0' && outisup(fmsbuf[1]))
                    {
                        /* use all caps */
                        allcaps = TRUE;
                    }
                }

                /* convert the entire string to lower case for searching */
                strcpy(fmsbuf_srch, fmsbuf);
                os_strlwr(fmsbuf_srch);
                
                /* find the string in the format string table */
                fmslen = strlen(fmsbuf_srch);
                for (fms = fmsbase ; fms < fmstop ; )
                {
                    uint propnum;
                    uint len;

                    /* get the information on this entry */
                    propnum = osrp2(fms);
                    len = osrp2(fms + 2) - 2;

                    /* check for a match */
                    if (len == fmslen &&
                        !memcmp(fms + 4, fmsbuf_srch, (size_t)len))
                    {
                        int old_all_caps;

                        /* note the current ALLCAPS mode */
                        old_all_caps = stream->allcapsflag;
                        
                        /* 
                         *   we have a match - set the appropriate
                         *   capitalization mode 
                         */
                        if (allcaps)
                            outallcaps_stream(stream, TRUE);
                        else if (initcap)
                            outcaps_stream(stream);

                        /* 
                         *   evaluate the associated property to generate
                         *   the substitution text 
                         */
                        runppr(runctx, cmdActor, (prpnum)propnum, 0);

                        /* turn off ALLCAPS mode */
                        outallcaps_stream(stream, old_all_caps);

                        /* no need to look any further */
                        break;
                    }

                    /* move on to next formatstring if not yet found */
                    fms += len + 4;
                }

                /* if we can't find it, dump the format string as-is */
                if (fms == fmstop)
                {
                    outchar_stream(stream, '%');
                    for (f1 = fmsbuf ; f1 < f ; ++f1)
                        outchar_stream(stream, *f1);
                    outchar_stream(stream, '%');
                }

                /* no longer reading format string */
                infmt = 0;
            }
            else
            {
                /* copy this character of the format string */
                *f++ = c;
            }

            /* move on to the next character and continue scanning */
            c = nextout(&s, &slen);
            continue;
        }
        
        /*
         *   If we're parsing HTML here, and we're inside a tag, skip
         *   characters until we reach the end of the tag.  
         */
        if (stream->html_mode_flag != HTML_MODE_NORMAL)
        {
            switch(stream->html_mode_flag)
            {
            case HTML_MODE_TAG:
                /* 
                 *   keep skipping up to the closing '>', but note when we
                 *   enter any quoted section 
                 */
                switch(c)
                {
                case '>':
                    /* we've reached the end of the tag */
                    stream->html_mode_flag = HTML_MODE_NORMAL;

                    /* if we have a deferred <BR>, process it now */
                    switch(stream->html_defer_br)
                    {
                    case HTML_DEFER_BR_NONE:
                        /* no deferred <BR> */
                        break;

                    case HTML_DEFER_BR_FLUSH:
                        outflushn_stream(stream, 1);
                        break;

                    case HTML_DEFER_BR_BLANK:
                        outblank_stream(stream);
                        break;
                    }

                    /* no more deferred <BR> pending */
                    stream->html_defer_br = HTML_DEFER_BR_NONE;

                    /* no more ALT attribute allowed */
                    stream->html_allow_alt = FALSE;
                    break;

                case '"':
                    /* enter a double-quoted string */
                    stream->html_mode_flag = HTML_MODE_DQUOTE;
                    break;

                case '\'':
                    /* enter a single-quoted string */
                    stream->html_mode_flag = HTML_MODE_SQUOTE;
                    break;

                default:
                    /* if it's alphabetic, note the attribute name */
                    if (outisal(c))
                    {
                        char attrname[128];
                        char attrval[256];
                        char *dst;

                        /* gather up the attribute name */
                        for (dst = attrname ;
                             dst + 1 < attrname + sizeof(attrname) ; )
                        {
                            /* store this character */
                            *dst++ = c;

                            /* get the next character */
                            c = nextout(&s, &slen);

                            /* if it's not alphanumeric, stop scanning */
                            if (!outisal(c) && !outisdg(c))
                                break;
                        }

                        /* null-terminate the result */
                        *dst++ = '\0';

                        /* gather the value if present */
                        if (c == '=')
                        {
                            char qu;
                            
                            /* skip the '=' */
                            c = nextout(&s, &slen);

                            /* if we have a quote, so note */
                            if (c == '"' || c == '\'')
                            {
                                /* remember the quote */
                                qu = c;

                                /* skip it */
                                c = nextout(&s, &slen);
                            }
                            else
                            {
                                /* no quote */
                                qu = 0;
                            }

                            /* read the value */
                            for (dst = attrval ;
                                 dst + 1 < attrval + sizeof(attrval) ; )
                            {
                                /* store this character */
                                *dst++ = c;

                                /* read the next one */
                                c = nextout(&s, &slen);
                                if (c == '\0')
                                {
                                    /* 
                                     *   we've reached the end of the
                                     *   string, and we're still inside
                                     *   this attribute - abandon the
                                     *   attribute but note that we're
                                     *   inside a quoted string if
                                     *   necessary 
                                     */
                                    if (qu == '"')
                                        stream->html_mode_flag =
                                            HTML_MODE_DQUOTE;
                                    else if (qu == '\'')
                                        stream->html_mode_flag =
                                            HTML_MODE_SQUOTE;
                                    else
                                        stream->html_mode_flag
                                            = HTML_MODE_TAG;

                                    /* stop scanning the string */
                                    break;
                                }

                                /* 
                                 *   if we're looking for a quote, check
                                 *   for the closing quote; otherwise,
                                 *   check for alphanumerics 
                                 */
                                if (qu != 0)
                                {
                                    /* if this is our quote, stop scanning */
                                    if (c == qu)
                                        break;
                                }
                                else
                                {
                                    /* if it's non-alphanumeric, we're done */
                                    if (!outisal(c) && !outisdg(c))
                                        break;
                                }
                            }

                            /* skip the closing quote, if necessary */
                            if (qu != 0 && c == qu)
                                c = nextout(&s, &slen);

                            /* null-terminate the value string */
                            *dst = '\0';
                        }
                        else
                        {
                            /* no value */
                            attrval[0] = '\0';
                        }

                        /* 
                         *   see if we recognize it, and it's meaningful
                         *   in the context of the current tag 
                         */
                        if (!stricmp(attrname, "height")
                            && stream->html_defer_br != HTML_DEFER_BR_NONE)
                        {
                            int ht;
                                
                            /*
                             *   If the height is zero, always treat this
                             *   as a non-blanking flush.  If it's one,
                             *   treat it as we originally planned to.  If
                             *   it's greater than one, add n blank lines.
                             */
                            ht = atoi(attrval);
                            if (ht == 0)
                            {
                                /* always use non-blanking flush */
                                stream->html_defer_br = HTML_DEFER_BR_FLUSH;
                            }
                            else if (ht == 1)
                            {
                                /* keep original setting */
                            }
                            else
                            {
                                for ( ; ht > 0 ; --ht)
                                    outblank_stream(stream);
                            }
                        }
                        else if (!stricmp(attrname, "alt")
                                 && !stream->html_in_ignore
                                 && stream->html_allow_alt)
                        {
                            /* write out the ALT string */
                            outstring_stream(stream, attrval);
                        }

                        /* 
                         *   since we already read the next character,
                         *   simply loop back immediately 
                         */
                        continue;
                    }
                    break;
                }
                break;

            case HTML_MODE_DQUOTE:
                /* if we've reached the closing quote, return to tag state */
                if (c == '"')
                    stream->html_mode_flag = HTML_MODE_TAG;
                break;

            case HTML_MODE_SQUOTE:
                /* if we've reached the closing quote, return to tag state */
                if (c == '\'')
                    stream->html_mode_flag = HTML_MODE_TAG;
                break;
            }

            /* 
             *   move on to the next character, and start over with the
             *   new character 
             */
            c = nextout(&s, &slen);
            continue;
        }

        /*
         *   If we're in a title, and this isn't the start of a new tag,
         *   skip the character - we suppress all regular text output
         *   inside a <TITLE> ... </TITLE> sequence. 
         */
        if (stream->html_in_ignore && c != '<')
        {
            /* check for entities */
            char cbuf[50];
            if (c == '&')
            {
                /* translate the entity */
                c = out_parse_entity(cbuf, sizeof(cbuf), &s, &slen);
            }
            else
            {
                /* it's an ordinary character - copy it out literally */
                cbuf[0] = c;
                cbuf[1] = '\0';

                /* get the next character */
                c = nextout(&s, &slen);
            }

            /* 
             *   if we're gathering a title, and there's room in the title
             *   buffer for more (always leaving room for a null
             *   terminator), add this to the title buffer 
             */
            if (stream->html_in_title)
            {
                char *cbp;
                for (cbp = cbuf ; *cbp != '\0' ; ++cbp)
                {
                    /* if there's room, add it */
                    if (stream->html_title_ptr + 1 <
                        stream->html_title_buf
                        + sizeof(stream->html_title_buf))
                        *stream->html_title_ptr++ = *cbp;
                }
            }

            /* don't display anything in an ignore section */
            continue;
        }
        
        if ( c == '%' )                              /* translation string? */
        {
            infmt = 1;
            f = fmsbuf;
        }
        else if ( c == '\\' )                       /* special escape code? */
        {
            c = nextout(&s, &slen);
            
            if (stream->capturing && c != '^' && c != 'v' && c != '\0')
            {
                outchar_stream(stream, '\\');
                outchar_stream(stream, c);

                /* keep the \- and also put out the next two chars */
                if (c == '-')
                {
                    outchar_stream(stream, nextout(&s, &slen));
                    outchar_stream(stream, nextout(&s, &slen));
                }
            }
            else
            {
                switch(c)
                {
                case 'H':                                /* HTML mode entry */
                    /* turn on HTML mode in the renderer */
                    switch(c = nextout(&s, &slen))
                    {
                    case '-':
                        /* if we have an HTML target, notify it */
                        if (stream->html_target)
                        {
                            /* flush its stream */
                            outflushn_stream(stream, 0);

                            /* tell the OS layer to switch to normal mode */
                            out_end_html(stream);
                        }

                        /* switch to normal mode */
                        stream->html_mode = FALSE;
                        break;

                    case '+':
                    default:
                        /* if we have an HTML target, notify it */
                        if (stream->html_target)
                        {
                            /* flush the underlying stream */
                            outflushn_stream(stream, 0);

                            /* tell the OS layer to switch to HTML mode */
                            out_start_html(stream);
                        }
                        
                        /* switch to HTML mode */
                        stream->html_mode = TRUE;

                        /* 
                         *   if the character wasn't a "+", it's not part
                         *   of the "\H" sequence, so display it normally 
                         */
                        if (c != '+' && c != 0)
                            outchar_stream(stream, c);
                        break;
                    }

                    /* this sequence doesn't result in any actual output */
                    break;

                case 'n':                                       /* newline? */
                    outflushn_stream(stream, 1);        /* yes, output line */
                    break;
                    
                case 't':                                           /* tab? */
                    outtab_stream(stream);
                    break;
                    
                case 'b':                                    /* blank line? */
                    outblank_stream(stream);
                    break;
                    
                case '\0':                               /* line ends here? */
                    done = 1;
                    break;

                case ' ':                                   /* quoted space */
                    if (stream->html_target && stream->html_mode)
                    {
                        /* 
                         *   we're generating for an HTML target and we're
                         *   in HTML mode - generate the HTML non-breaking
                         *   space 
                         */
                        outstring_stream(stream, "&nbsp;");
                    }
                    else
                    {
                        /* 
                         *   we're not in HTML mode - generate our
                         *   internal quoted space character 
                         */
                        outchar_stream(stream, QSPACE);
                    }
                    break;

                case '^':                      /* capitalize next character */
                    stream->capsflag = 1;
                    stream->nocapsflag = 0;
                    break;

                case 'v':
                    stream->nocapsflag = 1;
                    stream->capsflag = 0;
                    break;

                case '(':
                    /* generate HTML if in the appropriate mode */
                    if (stream->html_mode && stream->html_target)
                    {
                        /* send HTML to the renderer */
                        outstring_stream(stream, "<B>");
                    }
                    else
                    {
                        /* turn on the 'hilite' attribute */
                        stream->cur_attr |= OS_ATTR_HILITE;
                    }
                    break;

                case ')':
                    /* generate HTML if in the appropriate mode */
                    if (stream->html_mode && stream->html_target)
                    {
                        /* send HTML to the renderer */
                        outstring_stream(stream, "</B>");
                    }
                    else
                    {
                        /* turn off the 'hilite' attribute */
                        stream->cur_attr &= ~OS_ATTR_HILITE;
                    }
                    break;

                case '-':
                    outchar_stream(stream, nextout(&s, &slen));
                    outchar_stream(stream, nextout(&s, &slen));
                    break;
                    
                default:                 /* just pass invalid escapes as-is */
                    outchar_stream(stream, c);
                    break;
                }
            }
        }
        else if (!stream->html_target
                 && stream->html_mode
                 && (c == '<' || c == '&'))
        {
            /*
             *   We're in HTML mode, but the underlying target does not
             *   accept HTML sequences.  It appears we're at the start of
             *   an "&" entity or a tag sequence, so parse it, remove it,
             *   and replace it (if possible) with a text-only equivalent. 
             */
            if (c == '<')
            {
                /* read the tag */
                char tagbuf[50];
                int is_end_tag;
                c = read_tag(tagbuf, sizeof(tagbuf), &is_end_tag,
                             &s, &slen, 0);

                /*
                 *   Check to see if we recognize the tag.  We only
                 *   recognize a few simple tags that map easily to
                 *   character mode. 
                 */
                if (!stricmp(tagbuf, "br"))
                {
                    /* 
                     *   line break - if there's anything buffered up,
                     *   just flush the current line, otherwise write out
                     *   a blank line 
                     */
                    if (stream->html_in_ignore)
                        /* suppress breaks in ignore mode */;
                    else if (stream->linepos != 0)
                        stream->html_defer_br = HTML_DEFER_BR_FLUSH;
                    else
                        stream->html_defer_br = HTML_DEFER_BR_BLANK;
                }
                else if (!stricmp(tagbuf, "b")
                         || !stricmp(tagbuf, "i")
                         || !stricmp(tagbuf, "em")
                         || !stricmp(tagbuf, "strong"))
                {
                    int attr;
                    
                    /* choose the attribute flag */
                    switch (tagbuf[0])
                    {
                    case 'b':
                    case 'B':
                        attr = OS_ATTR_BOLD;
                        break;

                    case 'i':
                    case 'I':
                        attr = OS_ATTR_ITALIC;
                        break;

                    case 'e':
                    case 'E':
                        attr = OS_ATTR_EM;
                        break;

                    case 's':
                    case 'S':
                        attr = OS_ATTR_STRONG;
                        break;
                    }
                    
                    /* bold on/off - send out appropriate os-layer code */
                    if (stream->html_in_ignore)
                    {
                        /* suppress any change in 'ignore' mode */
                    }
                    else if (!is_end_tag)
                    {
                        /* turn on the selected attribute */
                        stream->cur_attr |= attr;
                    }
                    else
                    {
                        /* turn off the selected attribute */
                        stream->cur_attr &= ~attr;
                    }
                }
                else if (!stricmp(tagbuf, "p"))
                {
                    /* paragraph - send out a blank line */
                    if (!stream->html_in_ignore)
                        outblank_stream(stream);
                }
                else if (!stricmp(tagbuf, "tab"))
                {
                    /* tab - send out a \t */
                    if (!stream->html_in_ignore)
                        outtab_stream(stream);
                }
                else if (!stricmp(tagbuf, "img") || !stricmp(tagbuf, "sound"))
                {
                    /* IMG and SOUND - allow ALT attributes */
                    stream->html_allow_alt = TRUE;
                }
                else if (!stricmp(tagbuf, "hr"))
                {
                    int rem;
                    
                    if (!stream->html_in_ignore)
                    {
                        /* start a new line */
                        outflushn_stream(stream, 1);

                        /* write out underscores to the display width */
                        for (rem = G_os_linewidth - 1 ; rem > 0 ; )
                        {
                            char dashbuf[100];
                            int cur;
                            
                            /* do as much as we can on this pass */
                            cur = rem;
                            if ((size_t)cur > sizeof(dashbuf) - 1)
                                cur = sizeof(dashbuf) - 1;
                            
                            /* do a buffer-full of dashes */
                            memset(dashbuf, '_', cur);
                            dashbuf[cur] = '\0';
                            outstring_stream(stream, dashbuf);
                            
                            /* deduct this from the total */
                            rem -= cur;
                        }

                        /* put a blank line after the underscores */
                        outblank_stream(stream);
                    }
                }
                else if (!stricmp(tagbuf, "q"))
                {
                    unsigned int htmlchar;

                    if (!stream->html_in_ignore)
                    {
                        /* if it's an open quote, increment the level */
                        if (!is_end_tag)
                            ++(stream->html_quote_level);
                        
                        /* add the open quote */
                        htmlchar =
                            (!is_end_tag
                             ? ((stream->html_quote_level & 1) == 1
                                ? 8220 : 8216)
                             : ((stream->html_quote_level & 1) == 1
                                ? 8221 : 8217));
                        
                        /* 
                         *   write out the HTML character, translated to
                         *   the local character set 
                         */
                        outchar_html_stream(stream, htmlchar);
                        
                        /* if it's a close quote, decrement the level */
                        if (is_end_tag)
                            --(stream->html_quote_level);
                    }
                }
                else if (!stricmp(tagbuf, "title"))
                {
                    /* 
                     *   Turn ignore mode on or off as appropriate, and
                     *   turn on or off title mode as well.
                     */
                    if (is_end_tag)
                    {
                        /* 
                         *   note that we're leaving an ignore section and
                         *   a title section 
                         */
                        --(stream->html_in_ignore);
                        --(stream->html_in_title);

                        /* 
                         *   if we're no longer in a title, call the OS
                         *   layer to tell it the title string, in case it
                         *   wants to change the window title or otherwise
                         *   make use of the title 
                         */
                        if (stream->html_in_title == 0)
                        {
                            /* null-terminate the title string */
                            *stream->html_title_ptr = '\0';
                            
                            /* tell the OS about the title */
                            os_set_title(stream->html_title_buf);
                        }
                    }
                    else
                    {
                        /* 
                         *   if we aren't already in a title, set up to
                         *   capture the title into the title buffer 
                         */
                        if (!stream->html_in_title)
                            stream->html_title_ptr = stream->html_title_buf;

                        /* 
                         *   note that we're in a title and in an ignore
                         *   section, since nothing within gets displayed 
                         */
                        ++(stream->html_in_ignore);
                        ++(stream->html_in_title);
                    }
                }
                else if (!stricmp(tagbuf, "aboutbox"))
                {
                    /* turn ignore mode on or off as appropriate */
                    if (is_end_tag)
                        --(stream->html_in_ignore);
                    else
                        ++(stream->html_in_ignore);
                }
                else if (!stricmp(tagbuf, "pre"))
                {
                    /* count the nesting level if starting PRE mode */
                    if (!is_end_tag)
                        stream->html_pre_level += 1;

                    /* surround the PRE block with line breaks */
                    outblank_stream(stream);

                    /* count the nesting level if ending PRE mode */
                    if (is_end_tag && stream->html_pre_level != 0)
                        stream->html_pre_level -= 1;
                }

                /* suppress everything up to the next '>' */
                stream->html_mode_flag = HTML_MODE_TAG;

                /* 
                 *   continue with the current character; since we're in
                 *   html tag mode, we'll skip everything until we get to
                 *   the closing '>' 
                 */
                continue;
            }
            else if (c == '&')
            {
                /* parse it */
                char  xlat_buf[50];
                c = out_parse_entity(xlat_buf, sizeof(xlat_buf), &s, &slen);

                /* write it out (we've already translated it) */
                outstring_noxlat_stream(stream, xlat_buf);
                
                /* proceed with the next character */
                continue;
            }
        }
        else if (stream->html_target && stream->html_mode && c == '<')
        {
            /*
             *   We're in HTML mode, and we have an underlying HTML target.
             *   We don't need to do much HTML interpretation at this level.
             *   However, we do need to keep track of when we're in a PRE
             *   block, so that we can pass whitespaces and newlines through
             *   to the underlying HTML engine without filtering when we're
             *   in preformatted text. 
             */
            char tagbuf[50];
            int is_end_tag;
            c = read_tag(tagbuf, sizeof(tagbuf), &is_end_tag,
                         &s, &slen, stream);

            /* check for special tags */
            if (!stricmp(tagbuf, "pre"))
            {
                /* count the nesting level */
                if (!is_end_tag)
                    stream->html_pre_level += 1;
                else if (is_end_tag && stream->html_pre_level != 0)
                    stream->html_pre_level -= 1;
            }

            /* copy the last character after the tag to the stream */
            if (c != 0)
                outchar_stream(stream, c);
        }
        else
        {
            /* normal character */
            outchar_stream(stream, c);
        }

        /* move on to the next character, unless we're finished */
        if (done)
            c = '\0';
        else
            c = nextout(&s, &slen);
    }

    /* if we ended up inside what looked like a format string, dump string */
    if (infmt)
    {
        outchar_stream(stream, '%');
        for (f1 = fmsbuf ; f1 < f ; ++f1)
            outchar_stream(stream, *f1);
    }

    /* exit a recursion level */
    out_pop_stream();

    /* success */
    return 0;
}